

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
Swap(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     *this,RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *other)

{
  Rep *pRVar1;
  Rep *pRVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  if (this != other) {
    if ((other->super_RepeatedPtrFieldBase).arena_ != (this->super_RepeatedPtrFieldBase).arena_) {
      internal::RepeatedPtrFieldBase::
      SwapFallback<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                (&this->super_RepeatedPtrFieldBase,&other->super_RepeatedPtrFieldBase);
      return;
    }
    iVar4 = (this->super_RepeatedPtrFieldBase).current_size_;
    iVar5 = (this->super_RepeatedPtrFieldBase).total_size_;
    pRVar1 = (this->super_RepeatedPtrFieldBase).rep_;
    iVar3 = (other->super_RepeatedPtrFieldBase).total_size_;
    pRVar2 = (other->super_RepeatedPtrFieldBase).rep_;
    (this->super_RepeatedPtrFieldBase).current_size_ =
         (other->super_RepeatedPtrFieldBase).current_size_;
    (this->super_RepeatedPtrFieldBase).total_size_ = iVar3;
    (this->super_RepeatedPtrFieldBase).rep_ = pRVar2;
    (other->super_RepeatedPtrFieldBase).current_size_ = iVar4;
    (other->super_RepeatedPtrFieldBase).total_size_ = iVar5;
    (other->super_RepeatedPtrFieldBase).rep_ = pRVar1;
  }
  return;
}

Assistant:

inline void RepeatedPtrField<Element>::Swap(RepeatedPtrField* other) {
  if (this == other) return;
  RepeatedPtrFieldBase::Swap<TypeHandler>(other);
}